

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigTempor.c
# Opt level: O3

Aig_Man_t * Saig_ManTemporFrames(Aig_Man_t *pAig,int nFrames)

{
  char *__s;
  void *pvVar1;
  int iVar2;
  int iVar3;
  Aig_Man_t *p;
  size_t sVar4;
  char *__dest;
  Aig_Obj_t *pAVar5;
  ulong uVar6;
  Vec_Ptr_t *pVVar7;
  uint uVar8;
  Aig_Obj_t *p1;
  int iVar9;
  uint uVar10;
  long lVar11;
  
  Aig_ManCleanData(pAig);
  p = Aig_ManStart(pAig->vObjs->nSize * nFrames);
  __s = pAig->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar4 = strlen(__s);
    __dest = (char *)malloc(sVar4 + 1);
    strcpy(__dest,__s);
  }
  p->pName = __dest;
  iVar9 = pAig->nRegs;
  if (0 < iVar9) {
    iVar2 = 0;
    do {
      uVar8 = pAig->nTruePis + iVar2;
      if (((int)uVar8 < 0) || (pAig->vCis->nSize <= (int)uVar8)) goto LAB_006f9a82;
      *(ulong *)((long)pAig->vCis->pArray[uVar8] + 0x28) = (ulong)p->pConst1 ^ 1;
      iVar2 = iVar2 + 1;
      iVar9 = pAig->nRegs;
    } while (iVar2 < iVar9);
  }
  if (0 < nFrames) {
    iVar2 = 0;
    do {
      pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
      if (0 < pAig->nTruePis) {
        lVar11 = 0;
        do {
          if (pAig->vCis->nSize <= lVar11) goto LAB_006f9a82;
          pvVar1 = pAig->vCis->pArray[lVar11];
          pAVar5 = Aig_ObjCreateCi(p);
          *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar5;
          lVar11 = lVar11 + 1;
        } while (lVar11 < pAig->nTruePis);
      }
      pVVar7 = pAig->vObjs;
      if (0 < pVVar7->nSize) {
        lVar11 = 0;
        do {
          pvVar1 = pVVar7->pArray[lVar11];
          if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
            if (((ulong)pvVar1 & 1) != 0) goto LAB_006f9aa1;
            uVar6 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
            if (uVar6 == 0) {
              pAVar5 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar5 = (Aig_Obj_t *)
                       ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
            }
            uVar6 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
            if (uVar6 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            else {
              p1 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar6 + 0x28));
            }
            pAVar5 = Aig_And(p,pAVar5,p1);
            *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar5;
            pVVar7 = pAig->vObjs;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < pVVar7->nSize);
      }
      pVVar7 = pAig->vCos;
      if (0 < pVVar7->nSize) {
        lVar11 = 0;
        do {
          pvVar1 = pVVar7->pArray[lVar11];
          if (((ulong)pvVar1 & 1) != 0) {
LAB_006f9aa1:
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                          ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
          }
          uVar6 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
          if (uVar6 == 0) {
            uVar6 = 0;
          }
          else {
            uVar6 = (ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28);
          }
          *(ulong *)((long)pvVar1 + 0x28) = uVar6;
          lVar11 = lVar11 + 1;
          pVVar7 = pAig->vCos;
        } while (lVar11 < pVVar7->nSize);
      }
      iVar9 = pAig->nRegs;
      if (0 < iVar9) {
        iVar3 = 0;
        do {
          uVar8 = pAig->nTruePos + iVar3;
          if (((((int)uVar8 < 0) || (pAig->vCos->nSize <= (int)uVar8)) ||
              (uVar10 = pAig->nTruePis + iVar3, (int)uVar10 < 0)) ||
             (pAig->vCis->nSize <= (int)uVar10)) goto LAB_006f9a82;
          *(undefined8 *)((long)pAig->vCis->pArray[uVar10] + 0x28) =
               *(undefined8 *)((long)pAig->vCos->pArray[uVar8] + 0x28);
          iVar3 = iVar3 + 1;
          iVar9 = pAig->nRegs;
        } while (iVar3 < iVar9);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != nFrames);
  }
  if (0 < iVar9) {
    iVar9 = 0;
    do {
      uVar8 = pAig->nTruePos + iVar9;
      if (((int)uVar8 < 0) || (pAig->vCos->nSize <= (int)uVar8)) {
LAB_006f9a82:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Aig_ObjCreateCo(p,*(Aig_Obj_t **)((long)pAig->vCos->pArray[uVar8] + 0x28));
      iVar9 = iVar9 + 1;
    } while (iVar9 < pAig->nRegs);
  }
  Aig_ManCleanup(p);
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates initialized timeframes for temporal decomposition.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Man_t * Saig_ManTemporFrames( Aig_Man_t * pAig, int nFrames )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i, f;
    // start the frames package
    Aig_ManCleanData( pAig );
    pFrames = Aig_ManStart( Aig_ManObjNumMax(pAig) * nFrames );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    // initiliaze the flops
    Saig_ManForEachLo( pAig, pObj, i )
        pObj->pData = Aig_ManConst0(pFrames);
    // for each timeframe
    for ( f = 0; f < nFrames; f++ )
    {
        Aig_ManConst1(pAig)->pData = Aig_ManConst1(pFrames);
        Saig_ManForEachPi( pAig, pObj, i )
            pObj->pData = Aig_ObjCreateCi(pFrames);
        Aig_ManForEachNode( pAig, pObj, i )
            pObj->pData = Aig_And( pFrames, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
        Aig_ManForEachCo( pAig, pObj, i )
            pObj->pData = Aig_ObjChild0Copy(pObj);
        Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
            pObjLo->pData = pObjLi->pData;
    }
    // create POs for the flop inputs
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pFrames, (Aig_Obj_t *)pObj->pData );
    Aig_ManCleanup( pFrames );
    return pFrames;
}